

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O1

int lws_hdr_copy(lws *wsi,char *dst,int len,lws_token_indexes h)

{
  ushort uVar1;
  allocated_headers *paVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  paVar2 = (wsi->http).ah;
  iVar6 = 0;
  if ((paVar2 != (allocated_headers *)0x0) && (bVar4 = paVar2->frag_index[h], bVar4 != 0)) {
    iVar6 = 0;
    do {
      uVar5 = (ulong)bVar4;
      bVar4 = paVar2->frags[bVar4].nfrag;
      iVar6 = (uint)(bVar4 != 0 && h != WSI_TOKEN_HTTP_COOKIE) +
              (uint)paVar2->frags[uVar5].len + iVar6;
    } while (bVar4 != 0);
  }
  *dst = '\0';
  iVar3 = 0;
  if (iVar6 != 0) {
    if ((iVar6 < len) && (paVar2 = (wsi->http).ah, paVar2 != (allocated_headers *)0x0)) {
      bVar4 = paVar2->frag_index[h];
      if (bVar4 != 0) {
        do {
          paVar2 = (wsi->http).ah;
          bVar7 = paVar2->frags[bVar4].nfrag != '\0';
          uVar1 = paVar2->frags[bVar4].len;
          if (len <= (int)((uint)(bVar7 && h != WSI_TOKEN_HTTP_COOKIE) + (uint)uVar1))
          goto LAB_0011f8b6;
          strncpy(dst,paVar2->data + paVar2->frags[bVar4].offset,(ulong)uVar1);
          paVar2 = (wsi->http).ah;
          uVar1 = paVar2->frags[bVar4].len;
          dst = dst + uVar1;
          bVar4 = paVar2->frags[bVar4].nfrag;
          if (bVar7 && h != WSI_TOKEN_HTTP_COOKIE) {
            *dst = ',';
            dst = dst + 1;
          }
          len = len - (uint)uVar1;
        } while (bVar4 != 0);
        *dst = '\0';
        iVar3 = iVar6;
      }
    }
    else {
LAB_0011f8b6:
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

int lws_hdr_copy(struct lws *wsi, char *dst, int len,
			     enum lws_token_indexes h)
{
	int toklen = lws_hdr_total_length(wsi, h);
	int n;
	int comma;

	*dst = '\0';
	if (!toklen)
		return 0;

	if (toklen >= len)
		return -1;

	if (!wsi->http.ah)
		return -1;

	n = wsi->http.ah->frag_index[h];
	if (!n)
		return 0;

	do {
		comma = (wsi->http.ah->frags[n].nfrag &&
			h != WSI_TOKEN_HTTP_COOKIE) ? 1 : 0;

		if (wsi->http.ah->frags[n].len + comma >= len)
			return -1;
		strncpy(dst, &wsi->http.ah->data[wsi->http.ah->frags[n].offset],
		        wsi->http.ah->frags[n].len);
		dst += wsi->http.ah->frags[n].len;
		len -= wsi->http.ah->frags[n].len;
		n = wsi->http.ah->frags[n].nfrag;

		if (comma)
			*dst++ = ',';
				
	} while (n);
	*dst = '\0';

	return toklen;
}